

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int event_callback_cancel(uint id)

{
  int in_EDI;
  int pi;
  evtCallback_t *ep;
  evtCallback_t *__ptr;
  
  __ptr = geCallBackFirst;
  while( true ) {
    if (__ptr == (evtCallback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == in_EDI) break;
    __ptr = __ptr->next;
  }
  if (__ptr->prev == (evtCallback_t *)0x0) {
    geCallBackFirst = __ptr->next;
  }
  else {
    __ptr->prev->next = __ptr->next;
  }
  if (__ptr->next == (evtCallback_t *)0x0) {
    geCallBackLast = __ptr->prev;
  }
  else {
    __ptr->next->prev = __ptr->prev;
  }
  free(__ptr);
  findEventBits((int)((ulong)__ptr >> 0x20));
  return 0;
}

Assistant:

int event_callback_cancel(unsigned id)
{
   evtCallback_t *ep;
   int pi;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->id == id)
      {
         pi = ep->pi;

         if (ep->prev) {ep->prev->next = ep->next;}
         else          {geCallBackFirst = ep->next;}

         if (ep->next) {ep->next->prev = ep->prev;}
         else          {geCallBackLast = ep->prev;}

         free(ep);

         findEventBits(pi);

         return 0;
      }
      ep = ep->next;
   }
   return pigif_callback_not_found;
}